

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

int secp256k1_gej_has_quad_y_var(secp256k1_gej *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  secp256k1_fe *psVar72;
  ulong uVar73;
  ulong uVar74;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  secp256k1_fe yz;
  secp256k1_fe local_58;
  
  if (a->infinity != 0) {
    return 0;
  }
  psVar72 = &a->z;
  uVar71 = (a->y).n[0];
  uVar74 = (a->y).n[1];
  uVar1 = (a->y).n[2];
  uVar2 = (a->y).n[3];
  uVar3 = (a->y).n[4];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = psVar72->n[0];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (a->z).n[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (a->z).n[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar74;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (a->z).n[3];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar71;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (a->z).n[4];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar3;
  uVar68 = SUB168(auVar8 * auVar38,0);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar68 & 0xfffffffffffff;
  auVar4 = auVar5 * auVar35 + auVar4 * auVar34 + auVar6 * auVar36 + auVar7 * auVar37 +
           auVar9 * ZEXT816(0x1000003d10);
  uVar69 = auVar4._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar69 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = psVar72->n[0];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (a->z).n[1];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (a->z).n[2];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = (a->z).n[3];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar74;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (a->z).n[4];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar71;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar68 >> 0x34 | SUB168(auVar8 * auVar38,8) << 0xc;
  auVar4 = auVar10 * auVar39 + auVar60 + auVar11 * auVar40 + auVar12 * auVar41 + auVar13 * auVar42 +
           auVar14 * auVar43 + auVar15 * ZEXT816(0x1000003d10);
  uVar68 = auVar4._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar68 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = psVar72->n[0];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar71;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (a->z).n[1];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar3;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (a->z).n[2];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (a->z).n[3];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = (a->z).n[4];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar74;
  auVar4 = auVar17 * auVar45 + auVar61 + auVar18 * auVar46 + auVar19 * auVar47 + auVar20 * auVar48;
  uVar70 = auVar4._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar70 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = (uVar70 & 0xfffffffffffff) << 4 | (uVar68 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar16 * auVar44 + ZEXT816(0x1000003d1) * auVar49;
  uVar70 = auVar4._0_8_;
  local_58.n[0] = uVar70 & 0xfffffffffffff;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar70 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = psVar72->n[0];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar74;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = (a->z).n[1];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar71;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (a->z).n[2];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar3;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = (a->z).n[3];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = (a->z).n[4];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar1;
  auVar5 = auVar23 * auVar52 + auVar63 + auVar24 * auVar53 + auVar25 * auVar54;
  uVar70 = auVar5._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar70 & 0xfffffffffffff;
  auVar4 = auVar21 * auVar50 + auVar62 + auVar22 * auVar51 + auVar26 * ZEXT816(0x1000003d10);
  uVar73 = auVar4._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar70 >> 0x34 | auVar5._8_8_ << 0xc;
  local_58.n[1] = uVar73 & 0xfffffffffffff;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar73 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = psVar72->n[0];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar1;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = (a->z).n[1];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar74;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = (a->z).n[2];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar71;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = (a->z).n[3];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar3;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = (a->z).n[4];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar2;
  auVar5 = auVar30 * auVar58 + auVar65 + auVar31 * auVar59;
  uVar71 = auVar5._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar71 & 0xfffffffffffff;
  auVar4 = auVar27 * auVar55 + auVar64 + auVar28 * auVar56 + auVar29 * auVar57 +
           auVar32 * ZEXT816(0x1000003d10);
  uVar74 = auVar4._0_8_;
  local_58.n[2] = uVar74 & 0xfffffffffffff;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = (uVar74 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar69 & 0xfffffffffffff);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar71 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar66 = auVar33 * ZEXT816(0x1000003d10) + auVar66;
  uVar71 = auVar66._0_8_;
  local_58.n[3] = uVar71 & 0xfffffffffffff;
  local_58.n[4] = (uVar71 >> 0x34 | auVar66._8_8_ << 0xc) + (uVar68 & 0xffffffffffff);
  iVar67 = secp256k1_fe_impl_is_square_var(&local_58);
  return iVar67;
}

Assistant:

static int secp256k1_gej_has_quad_y_var(const secp256k1_gej *a) {
    secp256k1_fe yz;

    if (a->infinity) {
        return 0;
    }

    /* We rely on the fact that the Jacobi symbol of 1 / a->z^3 is the same as
     * that of a->z. Thus a->y / a->z^3 is a quadratic residue iff a->y * a->z
       is */
    secp256k1_fe_mul(&yz, &a->y, &a->z);
    return secp256k1_fe_is_square_var(&yz);
}